

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O1

RangeList * __thiscall
SoapySDR::Device::getBandwidthRange
          (RangeList *__return_storage_ptr__,Device *this,int direction,size_t channel)

{
  pointer *ppRVar1;
  iterator __position;
  undefined4 in_register_00000014;
  double *bw;
  double *pdVar2;
  double *local_50;
  double *local_48;
  Range local_38;
  
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_Device[0x45])(&local_50,this,CONCAT44(in_register_00000014,direction));
  if (local_50 != local_48) {
    pdVar2 = local_50;
    do {
      Range::Range(&local_38,*pdVar2,*pdVar2,0.0);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::
        _M_realloc_insert<SoapySDR::Range>(__return_storage_ptr__,__position,&local_38);
      }
      else {
        (__position._M_current)->_step = local_38._step;
        (__position._M_current)->_min = local_38._min;
        (__position._M_current)->_max = local_38._max;
        ppRVar1 = &(__return_storage_ptr__->
                   super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_48);
  }
  if (local_50 != (double *)0x0) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getBandwidthRange(const int direction, const size_t channel) const
{
    SoapySDR::RangeList ranges;
    //call into the older deprecated listBandwidths() call
    for (auto &bw : this->listBandwidths(direction, channel))
    {
        ranges.push_back(SoapySDR::Range(bw, bw));
    }
    return ranges;
}